

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

int socket_wait(int fd,int is_read)

{
  fd_set *__writefds;
  uint __i;
  int iVar1;
  long lVar2;
  fd_set *__readfds;
  timeval tv;
  fd_set fds;
  
  tv.tv_sec = 5;
  tv.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.__fds_bits[lVar2] = 0;
  }
  fds.__fds_bits[fd / 0x40] = fds.__fds_bits[fd / 0x40] | 1L << ((byte)fd & 0x3f);
  __readfds = &fds;
  __writefds = (fd_set *)0x0;
  if (is_read == 0) {
    __readfds = (fd_set *)0x0;
    __writefds = &fds;
  }
  iVar1 = select(fd + 1,(fd_set *)__readfds,(fd_set *)__writefds,(fd_set *)0x0,(timeval *)&tv);
  if (iVar1 == -1) {
    perror("select");
  }
  return iVar1;
}

Assistant:

static int socket_wait(int fd, int is_read)
{
	fd_set fds, *fdr = 0, *fdw = 0;
	struct timeval tv;
	int ret;
	tv.tv_sec = 5; tv.tv_usec = 0; // 5 seconds time out
	FD_ZERO(&fds);
	FD_SET(fd, &fds);
	if (is_read) fdr = &fds;
	else fdw = &fds;
	ret = select(fd+1, fdr, fdw, 0, &tv);
#ifndef _WIN32
	if (ret == -1) perror("select");
#else
	if (ret == 0)
		fprintf(stderr, "select time-out\n");
	else if (ret == SOCKET_ERROR)
		fprintf(stderr, "select: %d\n", WSAGetLastError());
#endif
	return ret;
}